

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::Mse16xHTest_RefMse_Test::TestBody(Mse16xHTest_RefMse_Test *this)

{
  Mse16xHTestClass<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>
  *in_stack_000000d0;
  
  Mse16xHTestClass<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>::
  RefMatchTestMse(in_stack_000000d0);
  return;
}

Assistant:

TEST_P(Mse16xHTest, RefMse) { RefMatchTestMse(); }